

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v5::internal::
       parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                 *handler)

{
  uint_least8_t *puVar1;
  char cVar2;
  type tVar3;
  basic_format_specs<char> *pbVar4;
  bool bVar5;
  byte bVar6;
  ulong uVar7;
  alignment aVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *local_38;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  local_30;
  
  if (begin == end) {
    return begin;
  }
  cVar2 = *begin;
  if (cVar2 == L'}') {
    return begin;
  }
  pbVar10 = (byte *)(begin + 1);
  uVar7 = (ulong)(pbVar10 != (byte *)end);
  do {
    bVar6 = begin[uVar7];
    if (0x3d < bVar6) {
      if (bVar6 == 0x5e) {
        aVar8 = ALIGN_CENTER;
      }
      else {
        if (bVar6 != 0x3e) goto LAB_00113ef8;
        aVar8 = ALIGN_RIGHT;
      }
LAB_00113f22:
      bVar5 = false;
LAB_00113f24:
      if ((int)uVar7 != 0) {
        if (cVar2 == '{') {
          error_handler::on_error
                    ((error_handler *)
                     (handler->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     ).context_,"invalid fill character \'{\'");
        }
        pbVar10 = (byte *)(begin + 2);
        (((handler->
          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ).super_specs_setter<char>.specs_)->super_align_spec).fill_ = (int)cVar2;
      }
      if ((bVar5) && (8 < handler->arg_type_ - named_arg_type)) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires numeric argument");
      }
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ).super_specs_setter<char>.specs_)->super_align_spec).align_ = aVar8;
      begin = (char *)pbVar10;
      break;
    }
    if (bVar6 == 0x3c) {
      aVar8 = ALIGN_LEFT;
      goto LAB_00113f22;
    }
    if (bVar6 == 0x3d) {
      aVar8 = ALIGN_NUMERIC;
      bVar5 = true;
      goto LAB_00113f24;
    }
LAB_00113ef8:
    bVar5 = 0 < (long)uVar7;
    uVar7 = uVar7 - 1;
  } while (bVar5);
  if (begin == end) {
    return (char *)(byte *)begin;
  }
  bVar6 = *begin;
  local_38 = (byte *)begin;
  if (bVar6 == 0x20) {
    tVar3 = handler->arg_type_;
    if (8 < tVar3 - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"format specifier requires numeric argument");
    }
    if ((tVar3 - named_arg_type < 7) &&
       ((char_type < tVar3 || ((0x94U >> (tVar3 & 0x1f) & 1) == 0)))) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"format specifier requires signed argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 1;
LAB_00114085:
    begin = (char *)((byte *)begin + 1);
  }
  else {
    if (bVar6 == 0x2d) {
      tVar3 = handler->arg_type_;
      if (8 < tVar3 - named_arg_type) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires numeric argument");
      }
      if ((tVar3 - named_arg_type < 7) &&
         ((char_type < tVar3 || ((0x94U >> (tVar3 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 4;
      goto LAB_00114085;
    }
    if (bVar6 == 0x2b) {
      tVar3 = handler->arg_type_;
      if (8 < tVar3 - named_arg_type) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires numeric argument");
      }
      if ((tVar3 - named_arg_type < 7) &&
         ((char_type < tVar3 || ((0x94U >> (tVar3 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 3;
      goto LAB_00114085;
    }
  }
  if (begin == end) {
    return (char *)(byte *)begin;
  }
  bVar6 = *begin;
  local_38 = (byte *)begin;
  if (bVar6 == 0x23) {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"format specifier requires numeric argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 8;
    local_38 = (byte *)begin + 1;
    if (local_38 == (byte *)end) {
      return (char *)local_38;
    }
    bVar6 = *local_38;
  }
  if (bVar6 == 0x30) {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"format specifier requires numeric argument");
    }
    pbVar4 = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    (pbVar4->super_align_spec).fill_ = L'0';
    (pbVar4->super_align_spec).align_ = ALIGN_NUMERIC;
    local_38 = local_38 + 1;
    if (local_38 == (byte *)end) {
      return (char *)local_38;
    }
    bVar6 = *local_38;
  }
  if ((byte)(bVar6 - 0x30) < 10) {
    pbVar10 = local_38 + 1;
    uVar9 = 0;
    pbVar11 = pbVar10;
    if (bVar6 != 0x30) {
      do {
        if (0xccccccc < uVar9) goto LAB_001141b5;
        uVar9 = ((uint)bVar6 + uVar9 * 10) - 0x30;
        pbVar10 = (byte *)end;
        if (pbVar11 == (byte *)end) break;
        bVar6 = *pbVar11;
        pbVar10 = pbVar11;
        pbVar11 = pbVar11 + 1;
      } while ((byte)(bVar6 - 0x30) < 10);
      if ((int)uVar9 < 0) {
LAB_001141b5:
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"number is too big");
      }
    }
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->super_align_spec).width_ = uVar9;
LAB_001141cb:
    local_38 = pbVar10;
    if (pbVar10 == (byte *)end) {
      return (char *)pbVar10;
    }
  }
  else if (bVar6 == 0x7b) {
    pbVar10 = local_38 + 1;
    if (pbVar10 != (byte *)end) {
      local_30.handler = handler;
      pbVar10 = (byte *)parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                                  ((char *)pbVar10,end,&local_30);
    }
    if ((pbVar10 == (byte *)end) || (*pbVar10 != 0x7d)) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"invalid format string");
    }
    pbVar10 = pbVar10 + 1;
    goto LAB_001141cb;
  }
  if (*local_38 == 0x2e) {
    pbVar10 = local_38 + 1;
    if (pbVar10 == (byte *)end) {
LAB_001142be:
      local_38 = pbVar10;
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"missing precision specifier");
    }
    if ((int)(char)*pbVar10 - 0x30U < 10) {
      local_38 = pbVar10;
      uVar9 = parse_nonnegative_int<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                        ((char **)&local_38,end,handler);
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ).super_specs_setter<char>.specs_)->super_core_format_specs).precision = uVar9;
    }
    else {
      if (*pbVar10 != 0x7b) goto LAB_001142be;
      pbVar10 = local_38 + 2;
      local_38 = pbVar10;
      if (pbVar10 != (byte *)end) {
        local_30.handler = handler;
        pbVar10 = (byte *)parse_arg_id<char,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                                    ((char *)pbVar10,end,
                                     (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
                                      *)&local_30);
      }
      if ((pbVar10 == (byte *)end) || (local_38 = pbVar10 + 1, *pbVar10 != 0x7d)) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).context_,"invalid format string");
      }
    }
    if ((handler->arg_type_ - named_arg_type < 7) || (handler->arg_type_ == pointer_type)) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).context_,"precision not allowed for this argument type");
    }
  }
  pbVar10 = local_38;
  if ((local_38 != (byte *)end) && (*local_38 != 0x7d)) {
    pbVar10 = local_38 + 1;
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ).super_specs_setter<char>.specs_)->super_core_format_specs).type = *local_38;
  }
  return (char *)pbVar10;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}